

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

char * get_attack_noun(CHAR_DATA *ch,int dt)

{
  uint uVar1;
  OBJ_DATA *pOVar2;
  long lVar3;
  
  pOVar2 = get_eq_char(ch,(uint)(gsn_dual_wield == dt) * 2 + 0x10);
  if (pOVar2 == (OBJ_DATA *)0x0) {
    uVar1 = (uint)ch->dam_type;
  }
  else {
    uVar1 = pOVar2->value[3];
  }
  lVar3 = 0x198;
  if (uVar1 - 1 < 0x3d) {
    lVar3 = (ulong)uVar1 * 0x18;
  }
  return *(char **)((long)&(attack_table.
                            super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
                            super__Vector_impl_data._M_start)->noun + lVar3);
}

Assistant:

char *get_attack_noun(CHAR_DATA *ch, int dt)
{
	OBJ_DATA *wield;
	int tmp_dt;
	char *attack;

	/*
	if(is_shifted(ch))
	{
		if(!attack_lookup(form_table[ch->pcdata->shifted].attack_type))
			return "Error";

		return attack_table[attack_lookup(form_table[ch->pcdata->shifted].attack_type)].noun;
	}
	*/

	tmp_dt = TYPE_HIT;

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	else
		wield = get_eq_char(ch, WEAR_WIELD);

	if (wield != nullptr)
		tmp_dt += wield->value[3];
	else
		tmp_dt += ch->dam_type;

	if (tmp_dt > TYPE_HIT && tmp_dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		attack = attack_table[tmp_dt - TYPE_HIT].noun;
	else
		attack = attack_table[17].noun;

	return attack;
}